

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaExist.c
# Opt level: O0

void Gia_ManQuantVerify(Gia_Man_t *p,int iObj)

{
  int iVar1;
  uint CiId_00;
  int iVar2;
  uint uVar3;
  word *p_00;
  Gia_Obj_t *pObj;
  int local_24;
  int CiId;
  int i;
  word *pInfo;
  int iObj_local;
  Gia_Man_t *p_local;
  
  p_00 = Gia_ManQuantInfoId(p,iObj);
  pObj = Gia_ManObj(p,iObj);
  iVar1 = Gia_ObjIsAnd(pObj);
  if (iVar1 == 0) {
    __assert_fail("Gia_ObjIsAnd(Gia_ManObj(p, iObj))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaExist.c"
                  ,0x59,"void Gia_ManQuantVerify(Gia_Man_t *, int)");
  }
  for (local_24 = 0; iVar1 = Vec_IntSize(&p->vSuppVars), local_24 < iVar1; local_24 = local_24 + 1)
  {
    CiId_00 = Vec_IntEntry(&p->vSuppVars,local_24);
    Gia_ManIncrementTravId(p);
    iVar1 = Abc_TtGetBit(p_00,local_24);
    iVar2 = Gia_ManQuantVerify_rec(p,iObj,CiId_00);
    if (iVar1 != iVar2) {
      uVar3 = Abc_TtGetBit(p_00,local_24);
      printf("Mismatch at node %d related to CI %d (%d).\n",(ulong)(uint)iObj,(ulong)CiId_00,
             (ulong)uVar3);
    }
  }
  return;
}

Assistant:

void Gia_ManQuantVerify( Gia_Man_t * p, int iObj )
{
    word * pInfo = Gia_ManQuantInfoId( p, iObj );  int i, CiId;
    assert( Gia_ObjIsAnd(Gia_ManObj(p, iObj)) );
    Vec_IntForEachEntry( &p->vSuppVars, CiId, i )
    {
        Gia_ManIncrementTravId( p );
        if ( Abc_TtGetBit(pInfo, i) != Gia_ManQuantVerify_rec(p, iObj, CiId) )
            printf( "Mismatch at node %d related to CI %d (%d).\n", iObj, CiId, Abc_TtGetBit(pInfo, i) );
    }
}